

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O3

RefCntAutoPtr<Diligent::IDeviceContext> * __thiscall
Diligent::RefCntAutoPtr<Diligent::IDeviceContext>::operator=
          (RefCntAutoPtr<Diligent::IDeviceContext> *this,IDeviceContext *pObj)

{
  IDeviceContext *pIVar1;
  
  pIVar1 = this->m_pObject;
  if (pIVar1 != pObj) {
    if (pIVar1 != (IDeviceContext *)0x0) {
      (*(pIVar1->super_IObject)._vptr_IObject[2])();
    }
    this->m_pObject = pObj;
    if (pObj != (IDeviceContext *)0x0) {
      (*(pObj->super_IObject)._vptr_IObject[1])(pObj);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }